

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgPort.c
# Opt level: O0

uint zvgReadMonitorInfo(ZvgMon_s *mon)

{
  uint uVar1;
  uint local_24;
  uint err;
  uint ecpErr;
  uint readLen;
  ZvgMon_s *mon_local;
  
  local_24 = 0;
  _ecpErr = mon;
  if ((ZvgIO.ecpFlags & 1) == 0) {
    local_24 = zvgSetEcpMode();
  }
  if (local_24 == 0) {
    zvgEcpPutc(0xec);
    zvgEcpPutc(0xe0);
    zvgEcpPutc(0xe0);
    zvgEcpPutc(0xe0);
    zvgEcpPutc(0xe0);
    zvgEcpPutc(0xe0);
    zvgEcpPutc(0xe0);
    zvgEcpPutc(0xe0);
    zvgEcpPutc(0xe0);
    mon_local._4_4_ = zvgIsDataAvail(1000);
    if (mon_local._4_4_ == 0) {
      local_24 = zvgGetMem(ZvgIO.mBfr,0x100,&err);
      if ((local_24 == 0) && (err != 0xb)) {
        local_24 = 0x14;
      }
      if (local_24 == 0) {
        _ecpErr->point_i = ZvgIO.mBfr[0];
        _ecpErr->zShift = ZvgIO.mBfr[1];
        _ecpErr->oShoot = ZvgIO.mBfr[2];
        _ecpErr->jumpFactor = ZvgIO.mBfr[3];
        _ecpErr->settle = ZvgIO.mBfr[4];
        _ecpErr->min_i = ZvgIO.mBfr[5];
        _ecpErr->max_i = ZvgIO.mBfr[6];
        _ecpErr->scale = ZvgIO.mBfr[7];
        _ecpErr->flags = ZvgIO.mBfr[8];
        _ecpErr->cksum = (ushort)ZvgIO.mBfr[9] + (ushort)ZvgIO.mBfr[10] * 0x100;
      }
      uVar1 = zvgSetEcpMode();
      if (uVar1 != 0) {
        local_24 = uVar1;
      }
      mon_local._4_4_ = local_24;
    }
  }
  else {
    mon_local._4_4_ = local_24;
  }
  return mon_local._4_4_;
}

Assistant:

uint zvgReadMonitorInfo( ZvgMon_s *mon)
{
	uint	readLen, ecpErr, err=0;

	if (!(ZvgIO.ecpFlags & ECPF_ECP))
		err = zvgSetEcpMode();				// if not ECP mode, set to ECP mode

	if (err)
		return (err);							// return on any errors

	// request monitor information
	//
	// The ZVG has a 9 byte look ahead buffer.  Until at least 9 bytes are
	// in it's command buffer, nothing will get executed.  This requires
	// the zcREAD_MON command to be followed by 8 NOPs in order to guarantee
	// execution.

	zvgEcpPutc( zcREAD_MON);				// setup to read monitor information
	zvgEcpPutc( zcNOP);						// must fill enough of buffer to allow
	zvgEcpPutc( zcNOP);						// READ_MON to execute
	zvgEcpPutc( zcNOP);
	zvgEcpPutc( zcNOP);
	zvgEcpPutc( zcNOP);
	zvgEcpPutc( zcNOP);
	zvgEcpPutc( zcNOP);
	zvgEcpPutc( zcNOP);

	// wait for command to execute, this could be behind a bunch of vector commands

	err = zvgIsDataAvail( 1000);			// allow a second for data to show up

	if (err)
		return (err);

	// read monitor information into a simple buffer

	err = zvgGetMem( ZvgIO.mBfr, ZVG_MAX_BFRSZ, &readLen);

	if (!err && (readLen != ZVG_MON_SIZE))
		err = errEcpBadData;

	if (!err)
	{
		// GCC does not pack its structure by default, so we need to move each value
		// one byte at a time

		mon->point_i = ZvgIO.mBfr[0];
		mon->zShift = ZvgIO.mBfr[1];
		mon->oShoot = ZvgIO.mBfr[2];
		mon->jumpFactor = ZvgIO.mBfr[3];
		mon->settle = ZvgIO.mBfr[4];
		mon->min_i = ZvgIO.mBfr[5];
		mon->max_i = ZvgIO.mBfr[6];
		mon->scale = ZvgIO.mBfr[7];
		mon->flags = ZvgIO.mBfr[8];

		// for word data, LSB byte is first.

		mon->cksum = ZvgIO.mBfr[9] + ((ushort)ZvgIO.mBfr[10] << 8);
	}

	// return to ECP mode

	ecpErr = zvgSetEcpMode();

	if (ecpErr)
		err = ecpErr;							// an ECP error has higher priority than a bad data error

	return (err);
}